

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::TestMakeCopy(bool use_local_arena)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  int iVar23;
  TemplateString *this;
  TemplateString *pTVar24;
  TemplateString *pTVar25;
  long lVar26;
  long *plVar27;
  char *pcVar28;
  undefined7 in_register_00000039;
  UnsafeArena *pUVar29;
  string copy;
  string orig;
  TemplateString local_448;
  TemplateString local_428;
  TemplateString local_408;
  TemplateString local_3e8;
  TemplateString local_3c8;
  TemplateString local_3a8;
  TemplateString local_388;
  TemplateString local_368;
  TemplateString local_348;
  TemplateString local_328;
  TemplateString local_308;
  TemplateString local_2e8;
  TemplateString local_2c8;
  TemplateString local_2a8;
  TemplateString local_288;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  UnsafeArena local_arena;
  
  ctemplate::UnsafeArena::UnsafeArena(&local_arena,0x400);
  pUVar29 = (UnsafeArena *)0x0;
  if ((int)CONCAT71(in_register_00000039,use_local_arena) != 0) {
    pUVar29 = &local_arena;
  }
  this = (TemplateString *)operator_new(0x70);
  ctemplate::TemplateString::TemplateString((TemplateString *)&orig,"testdict");
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)this,(TemplateString *)&orig,pUVar29);
  ctemplate::TemplateString::TemplateString(&local_1a8,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_1c8,"foo");
  TVar1.length_ = local_1a8.length_;
  TVar1.ptr_ = local_1a8.ptr_;
  TVar1.is_immutable_ = local_1a8.is_immutable_;
  TVar1._17_7_ = local_1a8._17_7_;
  TVar1.id_ = local_1a8.id_;
  TVar16.length_ = local_1c8.length_;
  TVar16.ptr_ = local_1c8.ptr_;
  TVar16.is_immutable_ = local_1c8.is_immutable_;
  TVar16._17_7_ = local_1c8._17_7_;
  TVar16.id_ = local_1c8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar16);
  ctemplate::TemplateString::TemplateString(&local_1e8,"TEMPLATELEVEL");
  ctemplate::TemplateString::TemplateString(&local_208,"foo3");
  TVar2.length_ = local_1e8.length_;
  TVar2.ptr_ = local_1e8.ptr_;
  TVar2.is_immutable_ = local_1e8.is_immutable_;
  TVar2._17_7_ = local_1e8._17_7_;
  TVar2.id_ = local_1e8.id_;
  TVar17.length_ = local_208.length_;
  TVar17.ptr_ = local_208.ptr_;
  TVar17.is_immutable_ = local_208.is_immutable_;
  TVar17._17_7_ = local_208._17_7_;
  TVar17.id_ = local_208.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar2,TVar17);
  ctemplate::TemplateString::TemplateString(&local_228,"include1");
  TVar3.length_ = local_228.length_;
  TVar3.ptr_ = local_228.ptr_;
  TVar3.is_immutable_ = local_228.is_immutable_;
  TVar3._17_7_ = local_228._17_7_;
  TVar3.id_ = local_228.id_;
  pTVar24 = (TemplateString *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  ctemplate::TemplateString::TemplateString(&local_248,"incfile1a");
  TVar4.length_ = local_248.length_;
  TVar4.ptr_ = local_248.ptr_;
  TVar4.is_immutable_ = local_248.is_immutable_;
  TVar4._17_7_ = local_248._17_7_;
  TVar4.id_ = local_248.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar4);
  ctemplate::TemplateString::TemplateString(&local_268,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_288,"subfoo");
  TVar5.length_ = local_268.length_;
  TVar5.ptr_ = local_268.ptr_;
  TVar5.is_immutable_ = local_268.is_immutable_;
  TVar5._17_7_ = local_268._17_7_;
  TVar5.id_ = local_268.id_;
  TVar18.length_ = local_288.length_;
  TVar18.ptr_ = local_288.ptr_;
  TVar18.is_immutable_ = local_288.is_immutable_;
  TVar18._17_7_ = local_288._17_7_;
  TVar18.id_ = local_288.id_;
  ctemplate::TemplateDictionary::SetValue(TVar5,TVar18);
  ctemplate::TemplateString::TemplateString(&local_2a8,"include1");
  TVar6.length_ = local_2a8.length_;
  TVar6.ptr_ = local_2a8.ptr_;
  TVar6.is_immutable_ = local_2a8.is_immutable_;
  TVar6._17_7_ = local_2a8._17_7_;
  TVar6.id_ = local_2a8.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar6);
  ctemplate::TemplateString::TemplateString(&local_2c8,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_2e8,"subbar");
  TVar7.length_ = local_2c8.length_;
  TVar7.ptr_ = local_2c8.ptr_;
  TVar7.is_immutable_ = local_2c8.is_immutable_;
  TVar7._17_7_ = local_2c8._17_7_;
  TVar7.id_ = local_2c8.id_;
  TVar19.length_ = local_2e8.length_;
  TVar19.ptr_ = local_2e8.ptr_;
  TVar19.is_immutable_ = local_2e8.is_immutable_;
  TVar19._17_7_ = local_2e8._17_7_;
  TVar19.id_ = local_2e8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar7,TVar19);
  ctemplate::TemplateString::TemplateString(&local_308,"section1");
  TVar8.length_ = local_308.length_;
  TVar8.ptr_ = local_308.ptr_;
  TVar8.is_immutable_ = local_308.is_immutable_;
  TVar8._17_7_ = local_308._17_7_;
  TVar8.id_ = local_308.id_;
  pTVar25 = (TemplateString *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar8);
  ctemplate::TemplateString::TemplateString(&local_328,"section1");
  TVar9.length_ = local_328.length_;
  TVar9.ptr_ = local_328.ptr_;
  TVar9.is_immutable_ = local_328.is_immutable_;
  TVar9._17_7_ = local_328._17_7_;
  TVar9.id_ = local_328.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar9);
  ctemplate::TemplateString::TemplateString(&local_348,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_368,"subfoo");
  TVar10.length_ = local_348.length_;
  TVar10.ptr_ = local_348.ptr_;
  TVar10.is_immutable_ = local_348.is_immutable_;
  TVar10._17_7_ = local_348._17_7_;
  TVar10.id_ = local_348.id_;
  TVar20.length_ = local_368.length_;
  TVar20.ptr_ = local_368.ptr_;
  TVar20.is_immutable_ = local_368.is_immutable_;
  TVar20._17_7_ = local_368._17_7_;
  TVar20.id_ = local_368.id_;
  ctemplate::TemplateDictionary::SetValue(TVar10,TVar20);
  ctemplate::TemplateString::TemplateString(&local_388,"SUBLEVEL");
  ctemplate::TemplateString::TemplateString(&local_3a8,"subbar");
  TVar11.length_ = local_388.length_;
  TVar11.ptr_ = local_388.ptr_;
  TVar11.is_immutable_ = local_388.is_immutable_;
  TVar11._17_7_ = local_388._17_7_;
  TVar11.id_ = local_388.id_;
  TVar21.length_ = local_3a8.length_;
  TVar21.ptr_ = local_3a8.ptr_;
  TVar21.is_immutable_ = local_3a8.is_immutable_;
  TVar21._17_7_ = local_3a8._17_7_;
  TVar21.id_ = local_3a8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar11,TVar21);
  ctemplate::TemplateString::TemplateString(&local_3c8,"section2");
  TVar12.length_ = local_3c8.length_;
  TVar12.ptr_ = local_3c8.ptr_;
  TVar12.is_immutable_ = local_3c8.is_immutable_;
  TVar12._17_7_ = local_3c8._17_7_;
  TVar12.id_ = local_3c8.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar12);
  ctemplate::TemplateString::TemplateString(&local_3e8,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_408,"bar");
  TVar13.length_ = local_3e8.length_;
  TVar13.ptr_ = local_3e8.ptr_;
  TVar13.is_immutable_ = local_3e8.is_immutable_;
  TVar13._17_7_ = local_3e8._17_7_;
  TVar13.id_ = local_3e8.id_;
  TVar22.length_ = local_408.length_;
  TVar22.ptr_ = local_408.ptr_;
  TVar22.is_immutable_ = local_408.is_immutable_;
  TVar22._17_7_ = local_408._17_7_;
  TVar22.id_ = local_408.id_;
  ctemplate::TemplateDictionary::SetValue(TVar13,TVar22);
  ctemplate::TemplateString::TemplateString(&local_428,"sub");
  TVar14.length_ = local_428.length_;
  TVar14.ptr_ = local_428.ptr_;
  TVar14.is_immutable_ = local_428.is_immutable_;
  TVar14._17_7_ = local_428._17_7_;
  TVar14.id_ = local_428.id_;
  lVar26 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar14);
  ctemplate::TemplateString::TemplateString(&local_448,"GLOBAL");
  TVar15.length_ = local_448.length_;
  TVar15.ptr_ = local_448.ptr_;
  TVar15.is_immutable_ = local_448.is_immutable_;
  TVar15._17_7_ = local_448._17_7_;
  TVar15.id_ = local_448.id_;
  ctemplate::TemplateDictionary::SetIntValue(TVar15,lVar26);
  orig._M_dataplus._M_p = (pointer)&orig.field_2;
  orig._M_string_length = 0;
  orig.field_2._M_local_buf[0] = '\0';
  (**(code **)(this->ptr_ + 0x20))(this,&orig,0);
  ctemplate::TemplateString::TemplateString((TemplateString *)&copy,"testdict");
  plVar27 = (long *)ctemplate::TemplateDictionary::MakeCopy(this,(UnsafeArena *)&copy);
  ctemplate::TemplateString::TemplateString((TemplateString *)&copy,"copy of subdict");
  lVar26 = ctemplate::TemplateDictionary::MakeCopy(pTVar24,(UnsafeArena *)&copy);
  if (lVar26 == 0) {
    ctemplate::TemplateString::TemplateString((TemplateString *)&copy,"copy of subdict");
    lVar26 = ctemplate::TemplateDictionary::MakeCopy(pTVar25,(UnsafeArena *)&copy);
    if (lVar26 == 0) {
      (**(code **)(this->ptr_ + 8))(this);
      copy._M_dataplus._M_p = (pointer)&copy.field_2;
      copy._M_string_length = 0;
      copy.field_2._M_local_buf[0] = '\0';
      (**(code **)(*plVar27 + 0x20))(plVar27,&copy,0);
      (**(code **)(*plVar27 + 8))(plVar27);
      iVar23 = strcmp(orig._M_dataplus._M_p,copy._M_dataplus._M_p);
      if (iVar23 == 0) {
        std::__cxx11::string::~string((string *)&copy);
        std::__cxx11::string::~string((string *)&orig);
        ctemplate::BaseArena::~BaseArena(&local_arena.super_BaseArena);
        return;
      }
      pcVar28 = "strcmp(orig.c_str(), copy.c_str()) == 0";
    }
    else {
      pcVar28 = "subdict_2a->MakeCopy(\"copy of subdict\") == __null";
    }
  }
  else {
    pcVar28 = "subdict_1a->MakeCopy(\"copy of subdict\") == __null";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar28);
  exit(1);
}

Assistant:

static void TestMakeCopy(bool use_local_arena) {
  UnsafeArena local_arena(1024);
  UnsafeArena* arena = NULL;
  if (use_local_arena)
    arena = &local_arena;

  // First, let's make a non-trivial template dictionary (We use
  // 'new' because later we'll test deleting this dict but keeping
  // around the copy.)
  TemplateDictionary* dict = new TemplateDictionary("testdict", arena);

  dict->SetValue("TOPLEVEL", "foo");

  dict->SetTemplateGlobalValue("TEMPLATELEVEL", "foo3");

  TemplateDictionary* subdict_1a = dict->AddIncludeDictionary("include1");
  subdict_1a->SetFilename("incfile1a");
  subdict_1a->SetValue("SUBLEVEL", "subfoo");
  TemplateDictionary* subdict_1b = dict->AddIncludeDictionary("include1");
  // Let's try not calling SetFilename on this one.
  subdict_1b->SetValue("SUBLEVEL", "subbar");

  TemplateDictionary* subdict_2a = dict->AddSectionDictionary("section1");
  TemplateDictionary* subdict_2b = dict->AddSectionDictionary("section1");
  subdict_2a->SetValue("SUBLEVEL", "subfoo");
  subdict_2b->SetValue("SUBLEVEL", "subbar");
  TemplateDictionary* subdict_3 = dict->AddSectionDictionary("section2");
  subdict_3->SetValue("TOPLEVEL", "bar");    // overriding top dict
  TemplateDictionary* subdict_3_1 = subdict_3->AddSectionDictionary("sub");
  subdict_3_1->SetIntValue("GLOBAL", 21);    // overrides value in setUp()

  string orig;
  dict->DumpToString(&orig);

  // Make a copy
  TemplateDictionary* dict_copy = dict->MakeCopy("testdict", NULL);
  // Make sure it doesn't work to copy a sub-dictionary
  EXPECT_TRUE(subdict_1a->MakeCopy("copy of subdict") == NULL);
  EXPECT_TRUE(subdict_2a->MakeCopy("copy of subdict") == NULL);

  // Delete the original dict, to make sure the copy really is independent
  delete dict;
  dict = NULL;
  string copy;
  dict_copy->DumpToString(&copy);
  delete dict_copy;

  EXPECT_STREQ(orig.c_str(), copy.c_str());
}